

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Perceptron.cpp
# Opt level: O1

ostream * PyreNet::operator<<(ostream *os,Perceptron *p)

{
  double *pdVar1;
  ostream *poVar2;
  double *pdVar3;
  
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)os,p->inputSize);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)os);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  pdVar1 = (p->weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar3 = (p->weights).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start; pdVar3 != pdVar1; pdVar3 = pdVar3 + 1) {
    poVar2 = std::ostream::_M_insert<double>(*pdVar3);
    std::__ostream_insert<char,std::char_traits<char>>(poVar2," ",1);
  }
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const Perceptron &p) {
        os << p.inputSize << " ";
        os << p.weights.size() << " ";
        for (double w : p.weights)
            os << w << " ";
        return os;
    }